

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

string * __thiscall
OperatorChar::toString_abi_cxx11_(string *__return_storage_ptr__,OperatorChar *this)

{
  allocator<char> local_52;
  char local_51;
  char *local_50;
  undefined8 local_48;
  allocator<char> local_2b;
  char local_2a;
  char local_29;
  char *local_28;
  undefined8 local_20;
  OperatorChar *local_18;
  OperatorChar *this_local;
  
  local_18 = this;
  this_local = (OperatorChar *)__return_storage_ptr__;
  if ((this->mIsTwoChars & 1U) == 0) {
    local_51 = this->mOp1;
    local_50 = &local_51;
    local_48 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_50,local_48,&local_52);
    std::allocator<char>::~allocator(&local_52);
  }
  else {
    local_2a = this->mOp1;
    local_29 = this->mOp2;
    local_28 = &local_2a;
    local_20 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_28,local_20,&local_2b);
    std::allocator<char>::~allocator(&local_2b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OperatorChar::toString() const {
	if (mIsTwoChars) {
		return std::string({ mOp1, mOp2 });
	} else {
		return std::string({ mOp1 });
	}
}